

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

int FIX::socket_getsockopt(socket_handle s,int opt,int *optval)

{
  int iVar1;
  socklen_t length;
  socklen_t local_4;
  
  iVar1 = getsockopt(s,(uint)(opt == 1) * 5 + 1,opt,optval,&local_4);
  return iVar1;
}

Assistant:

int socket_getsockopt(socket_handle s, int opt, int &optval) {
  int level = SOL_SOCKET;
  if (opt == TCP_NODELAY) {
    level = IPPROTO_TCP;
  }

#ifdef _MSC_VER
  int length = sizeof(int);
#else
  socklen_t length = sizeof(socklen_t);
#endif

  return ::getsockopt(s, level, opt, (char *)&optval, &length);
}